

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  cmDocumentationEntry *__args;
  pointer puVar1;
  cmGlobalGeneratorFactory *pcVar2;
  bool bVar3;
  pointer *__ptr;
  bool bVar4;
  pointer puVar5;
  string_view prefix;
  string_view str;
  cmDocumentationEntry e;
  string defaultName;
  undefined1 local_a8 [24];
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Base_ptr *local_78;
  _Rb_tree_node_base local_70;
  char *local_50;
  _Alloc_hider local_48;
  
  local_a8._8_8_ = v;
  EvaluateDefaultGlobalGenerator((cmake *)local_a8);
  (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
               *)local_a8._0_8_)->
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            )._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[3].
            _vptr_cmGlobalGeneratorFactory)(&local_50);
  puVar1 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __args = (cmDocumentationEntry *)(local_a8 + 0x10);
  bVar4 = false;
  for (puVar5 = (this->Generators).
                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    local_a8._16_8_ = &local_88;
    local_90 = (pointer)0x0;
    local_88._M_local_buf[0] = '\0';
    local_78 = &local_70._M_parent;
    local_70._M_color = _S_red;
    local_70._4_4_ = 0;
    local_70._M_parent._0_1_ = 0;
    local_70._M_right._0_1_ = 0x20;
    pcVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
             .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl;
    (*pcVar2->_vptr_cmGlobalGeneratorFactory[3])(pcVar2,__args);
    bVar3 = !bVar4;
    bVar4 = true;
    if (bVar3) {
      prefix._M_str = local_50;
      prefix._M_len = (size_t)local_48._M_p;
      str._M_str = (char *)local_a8._16_8_;
      str._M_len = (size_t)local_90;
      bVar3 = cmHasPrefix(str,prefix);
      if (bVar3) {
        local_70._M_right._0_1_ = 0x2a;
      }
      else {
        bVar4 = false;
      }
    }
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
    emplace_back<cmDocumentationEntry>
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_a8._8_8_
               ,__args);
    cmDocumentationEntry::~cmDocumentationEntry(__args);
  }
  std::__cxx11::string::~string((string *)&local_50);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_a8._0_8_)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (const auto& g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne && cmHasPrefix(e.Name, defaultName)) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}